

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void mkfount(level *lev,int mazeflag,mkroom *croom)

{
  boolean bVar1;
  int iVar2;
  bool bVar3;
  int local_28;
  coord local_22;
  int tryct;
  coord m;
  mkroom *croom_local;
  int mazeflag_local;
  level *lev_local;
  
  local_28 = 0;
  _tryct = croom;
  do {
    local_28 = local_28 + 1;
    if (200 < local_28) {
      return;
    }
    if (mazeflag == 0) {
      bVar1 = somexy(lev,_tryct,&local_22);
      if (bVar1 == '\0') {
        return;
      }
    }
    else {
      mazexy(lev,&local_22);
    }
    bVar1 = occupied(lev,local_22.x,local_22.y);
    bVar3 = true;
    if (bVar1 == '\0') {
      bVar1 = bydoor(lev,local_22.x,local_22.y);
      bVar3 = bVar1 != '\0';
    }
  } while (bVar3);
  lev->locations[local_22.x][local_22.y].typ = '\x1c';
  iVar2 = rn2(7);
  if (iVar2 == 0) {
    *(uint *)&lev->locations[local_22.x][local_22.y].field_0x6 =
         *(uint *)&lev->locations[local_22.x][local_22.y].field_0x6 & 0xfffffdff | 0x200;
  }
  (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
  return;
}

Assistant:

static void mkfount(struct level *lev, int mazeflag, struct mkroom *croom)
{
	coord m;
	int tryct = 0;

	do {
	    if (++tryct > 200) return;
	    if (mazeflag)
		mazexy(lev, &m);
	    else
		if (!somexy(lev, croom, &m))
		    return;
	} while (occupied(lev, m.x, m.y) || bydoor(lev, m.x, m.y));

	/* Put a fountain at m.x, m.y */
	lev->locations[m.x][m.y].typ = FOUNTAIN;
	/* Is it a "blessed" fountain? (affects drinking from fountain) */
	if (!rn2(7)) lev->locations[m.x][m.y].blessedftn = 1;

	lev->flags.nfountains++;
}